

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbiw__outfile(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,
                  void *data,int alpha,int pad,char *fmt,...)

{
  long lVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  undefined4 uVar6;
  void *pvVar7;
  bool bVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list v;
  void *local_140;
  undefined4 local_134;
  ulong local_130;
  uchar *local_128;
  long local_120;
  long local_118;
  long local_110;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  uVar6 = (undefined4)((ulong)_comp >> 0x20);
  iVar2 = (int)_comp;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    iVar2 = 0;
  }
  else {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &stack0x00000030;
    local_108.gp_offset = 0x30;
    local_108.fp_offset = 0x30;
    iVar5 = iVar2;
    stbiw__writefv(s,fmt,&local_108);
    local_134 = 0;
    if (0 < y) {
      iVar3 = y + -1;
      local_118 = (ulong)(stbi__flip_vertically_on_write != 0) * 2 + -1;
      if (stbi__flip_vertically_on_write != 0) {
        iVar3 = 0;
      }
      bVar8 = stbi__flip_vertically_on_write == 0;
      local_128 = s->buffer;
      local_110 = (long)iVar3;
      local_130 = (ulong)(uint)x;
      local_120 = (long)x * (long)iVar2;
      local_140 = (void *)(local_110 * local_120 + (long)data);
      local_120 = local_120 * local_118;
      do {
        uVar4 = local_130;
        pvVar7 = local_140;
        if (0 < x) {
          do {
            stbiw__write_pixel(s,iVar2,alpha,expand_mono,(int)pvVar7,(uchar *)CONCAT44(uVar6,iVar5))
            ;
            uVar4 = uVar4 - 1;
            pvVar7 = (void *)((long)pvVar7 + (long)iVar2);
          } while (uVar4 != 0);
        }
        lVar1 = local_110;
        if (s->buf_used != 0) {
          (*s->func)(s->context,local_128,s->buf_used);
          s->buf_used = 0;
        }
        (*s->func)(s->context,&local_134,pad);
        local_110 = lVar1 + local_118;
        local_140 = (void *)((long)local_140 + local_120);
      } while ((-(uint)bVar8 | y) != (uint)local_110);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbiw__outfile(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   if (y < 0 || x < 0) {
      return 0;
   } else {
      va_list v;
      va_start(v, fmt);
      stbiw__writefv(s, fmt, v);
      va_end(v);
      stbiw__write_pixels(s,rgb_dir,vdir,x,y,comp,data,alpha,pad, expand_mono);
      return 1;
   }
}